

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  value_type vVar4;
  value_type *pvVar5;
  size_t sVar6;
  ulong uVar7;
  value_type vVar8;
  long lVar9;
  char *digits;
  char *pcVar10;
  value_type *pvVar11;
  value_type avStack_39 [25];
  char buffer [18];
  
  pvVar5 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar8 = it->blackhole_;
  pcVar10 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)this + 8) + 0x11) == 'x') {
    pcVar10 = "0123456789abcdef";
  }
  iVar1 = *(int *)(this + 8);
  pvVar11 = avStack_39 + iVar1;
  uVar7 = *(ulong *)(*(long *)this + 0x10);
  do {
    *pvVar11 = pcVar10[(uint)uVar7 & 0xf];
    pvVar11 = pvVar11 + -1;
    bVar3 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar3);
  if (0 < iVar1) {
    lVar9 = 0;
    do {
      vVar4 = avStack_39[lVar9 + 1];
      if (sVar6 + lVar9 < uVar2) {
        *pvVar5 = avStack_39[lVar9 + 1];
        vVar4 = vVar8;
      }
      vVar8 = vVar4;
      pvVar5 = pvVar5 + (sVar6 + lVar9 < uVar2);
      lVar9 = lVar9 + 1;
    } while (iVar1 != lVar9);
    sVar6 = sVar6 + lVar9;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar5;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar6;
  it->blackhole_ = vVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }